

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::~ConsoleReporter(ConsoleReporter *this)

{
  (this->super_StreamingReporterBase).super_SharedImpl<Catch::IStreamingReporter>.
  super_IStreamingReporter.super_IShared.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__ConsoleReporter_001bee38;
  std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::~vector
            (&(this->super_StreamingReporterBase).m_sectionStack);
  Option<Catch::TestCaseInfo>::reset
            (&(this->super_StreamingReporterBase).currentTestCaseInfo.
              super_Option<Catch::TestCaseInfo>);
  Option<Catch::GroupInfo>::reset
            (&(this->super_StreamingReporterBase).currentGroupInfo.super_Option<Catch::GroupInfo>);
  Option<Catch::TestRunInfo>::reset
            (&(this->super_StreamingReporterBase).currentTestRunInfo.
              super_Option<Catch::TestRunInfo>);
  Ptr<const_Catch::IConfig>::~Ptr(&(this->super_StreamingReporterBase).m_config);
  return;
}

Assistant:

StreamingReporterBase::~StreamingReporterBase() {}